

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O0

char * proto_token(char *proto)

{
  int iVar1;
  char **local_20;
  char **builtin;
  char *proto_local;
  
  if (proto == (char *)0x0) {
    proto_local = (char *)0x0;
  }
  else {
    local_20 = built_in_protos;
    while ((*local_20 != (char *)0x0 && (iVar1 = curl_strequal(*local_20,proto), iVar1 == 0))) {
      local_20 = local_20 + 1;
    }
    proto_local = *local_20;
  }
  return proto_local;
}

Assistant:

const char *proto_token(const char *proto)
{
  const char * const *builtin;

  if(!proto)
    return NULL;
  for(builtin = built_in_protos; *builtin; builtin++)
    if(curl_strequal(*builtin, proto))
      break;
  return *builtin;
}